

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFileImpl
          (DescriptorBuilder *this,FileDescriptorProto *proto)

{
  vector<int,_std::allocator<int>_> *__x;
  size_type *psVar1;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *this_00;
  once_flag *poVar2;
  Message *message;
  pointer pOVar3;
  pointer piVar4;
  pointer pcVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  DescriptorBuilder *file;
  SourceCodeInfo *this_01;
  FileDescriptorTables *pFVar10;
  DescriptorPool *pDVar11;
  Tables *pTVar12;
  void *pvVar13;
  once_flag *poVar14;
  const_iterator cVar15;
  const_iterator cVar16;
  string *psVar17;
  FileDescriptor *pFVar18;
  _Base_ptr p_Var19;
  pointer pOVar20;
  undefined4 extraout_var;
  FieldDescriptor *pFVar21;
  LogMessage *pLVar22;
  undefined4 extraout_var_00;
  MessageLite *this_02;
  long *plVar23;
  undefined8 *puVar24;
  undefined1 *puVar25;
  long lVar26;
  _Base_ptr *pp_Var27;
  long lVar28;
  void *extraout_RDX;
  void *extraout_RDX_00;
  FileDescriptor *extraout_RDX_01;
  Reflection *this_03;
  Reflection *this_04;
  Reflection *this_05;
  Reflection *this_06;
  Reflection *this_07;
  FileDescriptor *extraout_RDX_02;
  FileDescriptor *extraout_RDX_03;
  FileDescriptor *extraout_RDX_04;
  MessageLite *pMVar29;
  undefined1 *puVar30;
  undefined8 uVar31;
  undefined1 *puVar32;
  undefined1 *puVar33;
  int i;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar34;
  pair<std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>,_std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>_>
  pVar35;
  FileDescriptor *dependency;
  vector<int,_std::allocator<int>_> src_path;
  set<int,_std::less<int>,_std::allocator<int>_> weak_deps;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen_dependencies;
  undefined1 local_260 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250 [2];
  string local_228;
  pointer local_208;
  vector<int,_std::allocator<int>_> local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Base_ptr local_1d8;
  long lStack_1d0;
  SourceCodeInfo *local_1c8;
  MessageLite *local_1c0;
  string local_1b8;
  _Base_ptr local_198;
  long local_190;
  FileDescriptor *local_188;
  _Base_ptr p_Stack_180;
  DescriptorBuilder *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  undefined1 auStack_160 [56];
  _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  local_128;
  DynamicMessageFactory local_f8;
  string local_b0;
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  size_type local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  undefined4 extraout_var_01;
  
  file = (DescriptorBuilder *)DescriptorPool::Tables::AllocateBytes(this->tables_,0xa0);
  this->file_ = (FileDescriptor *)file;
  *(undefined2 *)&(file->filename_)._M_string_length = 0;
  if (((proto->_has_bits_).has_bits_[0] & 0x10) == 0) {
    local_1c8 = (SourceCodeInfo *)0x0;
    this_01 = SourceCodeInfo::default_instance();
  }
  else {
    this_01 = DescriptorPool::Tables::AllocateMessage<google::protobuf::SourceCodeInfo>
                        (this->tables_,(SourceCodeInfo *)0x0);
    puVar30 = (undefined1 *)proto->source_code_info_;
    if ((SourceCodeInfo *)puVar30 == (SourceCodeInfo *)0x0) {
      puVar30 = _SourceCodeInfo_default_instance_;
    }
    SourceCodeInfo::CopyFrom(this_01,(SourceCodeInfo *)puVar30);
    local_1c8 = this_01;
  }
  *(SourceCodeInfo **)&(file->unused_dependency_)._M_t._M_impl = this_01;
  pFVar10 = DescriptorPool::Tables::AllocateFileTables(this->tables_);
  this->file_tables_ = pFVar10;
  *(FileDescriptorTables **)(this->file_ + 0x90) = pFVar10;
  if (((proto->_has_bits_).has_bits_[0] & 1) == 0) {
    local_170._8_8_ = 0;
    auStack_160._0_8_ = auStack_160._0_8_ & 0xffffffffffffff00;
    local_170._M_allocated_capacity = (size_type)(DescriptorBuilder *)auStack_160;
    AddError(this,(string *)&local_170,&proto->super_Message,OTHER,
             "Missing field: FileDescriptorProto.name.");
    if ((DescriptorBuilder *)local_170._M_allocated_capacity != (DescriptorBuilder *)auStack_160) {
      operator_delete((void *)local_170._M_allocated_capacity);
    }
  }
  psVar17 = (proto->syntax_).ptr_;
  if ((psVar17->_M_string_length == 0) ||
     (iVar8 = std::__cxx11::string::compare((char *)psVar17), iVar8 == 0)) {
    *(undefined4 *)(this->file_ + 0x3c) = 2;
  }
  else {
    iVar8 = std::__cxx11::string::compare((char *)(proto->syntax_).ptr_);
    if (iVar8 == 0) {
      *(undefined4 *)(this->file_ + 0x3c) = 3;
    }
    else {
      *(undefined4 *)(this->file_ + 0x3c) = 0;
      psVar17 = (proto->name_).ptr_;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170
                     ,"Unrecognized syntax: ",(proto->syntax_).ptr_);
      AddError(this,psVar17,&proto->super_Message,OTHER,(string *)&local_170);
      if ((DescriptorBuilder *)local_170._M_allocated_capacity != (DescriptorBuilder *)auStack_160)
      {
        operator_delete((void *)local_170._M_allocated_capacity);
      }
    }
  }
  pDVar11 = (DescriptorPool *)
            DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  file->pool_ = pDVar11;
  if (((proto->_has_bits_).has_bits_[0] & 2) == 0) {
    local_170._8_8_ = 0;
    auStack_160._0_8_ = auStack_160._0_8_ & 0xffffffffffffff00;
    local_170._M_allocated_capacity = (size_type)(DescriptorBuilder *)auStack_160;
    pTVar12 = (Tables *)DescriptorPool::Tables::AllocateString(this->tables_,(string *)&local_170);
    file->tables_ = pTVar12;
    if ((DescriptorBuilder *)local_170._M_allocated_capacity != (DescriptorBuilder *)auStack_160) {
      operator_delete((void *)local_170._M_allocated_capacity);
    }
  }
  else {
    pTVar12 = (Tables *)DescriptorPool::Tables::AllocateString(this->tables_,(proto->package_).ptr_)
    ;
    file->tables_ = pTVar12;
  }
  file->error_collector_ = (ErrorCollector *)this->pool_;
  bVar6 = DescriptorPool::Tables::AddFile(this->tables_,(FileDescriptor *)file);
  if (bVar6) {
    if ((file->tables_->pending_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      AddPackage(this,(string *)file->tables_,&proto->super_Message,(FileDescriptor *)file);
    }
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar8 = (proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)&(file->options_to_interpret_).
             super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
             ._M_impl.super__Vector_impl_data._M_finish = iVar8;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    pvVar13 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar8 << 3);
    (file->filename_).field_2._M_allocated_capacity = (size_type)pvVar13;
    if (this->pool_->lazily_build_dependencies_ == true) {
      poVar14 = DescriptorPool::Tables::AllocateOnceDynamic(this->tables_);
      (file->options_to_interpret_).
      super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)poVar14;
      pvVar13 = DescriptorPool::Tables::AllocateBytes
                          (this->tables_,
                           (proto->dependency_).super_RepeatedPtrFieldBase.current_size_ << 3);
      *(void **)((long)&(file->filename_).field_2 + 8) = pvVar13;
      lVar28 = (long)(proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
      if (0 < lVar28) {
        memset(pvVar13,0,lVar28 << 3);
      }
    }
    else {
      (file->options_to_interpret_).
      super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      *(undefined8 *)((long)&(file->filename_).field_2 + 8) = 0;
    }
    this_00 = &this->unused_dependency_;
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear(&this_00->_M_t);
    local_90._24_8_ = local_90 + 8;
    local_90._8_4_ = _S_red;
    local_90._16_8_ = (undefined1 *)0x0;
    local_68 = 0;
    local_70._M_p = (pointer)local_90._24_8_;
    if (0 < (proto->weak_dependency_).current_size_) {
      lVar28 = 0;
      do {
        local_170._M_allocated_capacity._0_4_ =
             *(undefined4 *)((long)(proto->weak_dependency_).arena_or_elements_ + lVar28 * 4);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>
                  ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   local_90,(int *)local_170._M_local_buf);
        lVar28 = lVar28 + 1;
      } while (lVar28 < (proto->weak_dependency_).current_size_);
    }
    if (0 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_) {
      lVar28 = 0;
      do {
        pVar34 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&local_60,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[lVar28]
                           );
        if (((undefined1  [16])pVar34 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          AddTwiceListedError(this,proto,(int)lVar28);
        }
        local_170._M_allocated_capacity =
             *((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[lVar28];
        cVar15 = std::
                 _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->tables_->files_by_name_)._M_h,
                        (key_type *)&local_170._M_allocated_capacity);
        if (cVar15.
            super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_260._0_8_ = (DescriptorBuilder *)0x0;
LAB_002c4906:
          pDVar11 = this->pool_;
          if (pDVar11->underlay_ != (DescriptorPool *)0x0) {
            local_260._0_8_ =
                 DescriptorPool::FindFileByName
                           (pDVar11->underlay_,
                            (string *)
                            ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[lVar28]
                           );
            goto LAB_002c492d;
          }
LAB_002c4995:
          if (pDVar11->lazily_build_dependencies_ == false) {
            if (pDVar11->allow_unknown_ == false) {
              if ((undefined1 *)local_90._16_8_ != (undefined1 *)0x0 &&
                  pDVar11->enforce_weak_ == false) {
                puVar30 = (undefined1 *)local_90._16_8_;
                puVar33 = local_90 + 8;
                do {
                  puVar32 = puVar33;
                  puVar25 = puVar30;
                  lVar26 = (long)*(int *)(puVar25 + 0x20);
                  puVar33 = puVar25;
                  if (lVar26 < lVar28) {
                    puVar33 = puVar32;
                  }
                  puVar30 = *(undefined1 **)(puVar25 + (ulong)(lVar26 < lVar28) * 8 + 0x10);
                } while (*(undefined1 **)(puVar25 + (ulong)(lVar26 < lVar28) * 8 + 0x10) !=
                         (undefined1 *)0x0);
                if (puVar33 != local_90 + 8) {
                  if (lVar26 < lVar28) {
                    puVar25 = puVar32;
                  }
                  if (*(int *)(puVar25 + 0x20) <= lVar28) goto LAB_002c49a5;
                }
              }
              AddImportError(this,proto,(int)lVar28);
            }
            else {
LAB_002c49a5:
              local_260._0_8_ =
                   DescriptorPool::NewPlaceholderFileWithMutexHeld
                             (pDVar11,(string *)
                                      ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->
                                      elements[lVar28]);
            }
          }
        }
        else {
          local_260._0_8_ =
               *(long *)((long)cVar15.
                               super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
                               ._M_cur + 0x10);
          if ((DescriptorBuilder *)local_260._0_8_ == (DescriptorBuilder *)0x0) goto LAB_002c4906;
LAB_002c492d:
          if ((DescriptorBuilder *)local_260._0_8_ == file) {
            file = (DescriptorBuilder *)0x0;
            goto LAB_002c5641;
          }
          pDVar11 = this->pool_;
          if ((DescriptorBuilder *)local_260._0_8_ == (DescriptorBuilder *)0x0) goto LAB_002c4995;
          if (((pDVar11->enforce_dependencies_ == true) &&
              (cVar16 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::find(&(pDVar11->unused_import_track_files_)._M_t,(proto->name_).ptr_),
              (_Rb_tree_header *)cVar16._M_node !=
              &(this->pool_->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header)) &&
             (*(int *)(local_260._0_8_ + 0x24) == 0)) {
            std::
            _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
            ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                      ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                        *)this_00,(FileDescriptor **)local_260);
          }
        }
        *(undefined8 *)((file->filename_).field_2._M_allocated_capacity + lVar28 * 8) =
             local_260._0_8_;
        if (((DescriptorBuilder *)local_260._0_8_ == (DescriptorBuilder *)0x0 &
            this->pool_->lazily_build_dependencies_) == 1) {
          psVar17 = DescriptorPool::Tables::AllocateString
                              (this->tables_,
                               (string *)
                               ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements
                               [lVar28]);
          *(string **)(*(long *)((long)&(file->filename_).field_2 + 8) + lVar28 * 8) = psVar17;
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_);
    }
    pFVar18 = (FileDescriptor *)
              DescriptorPool::Tables::AllocateBytes
                        (this->tables_,(proto->public_dependency_).current_size_ << 2);
    file->file_ = pFVar18;
    if ((proto->public_dependency_).current_size_ < 1) {
      iVar8 = 0;
    }
    else {
      lVar28 = 0;
      iVar8 = 0;
      do {
        iVar9 = *(int *)((long)(proto->public_dependency_).arena_or_elements_ + lVar28 * 4);
        if (((long)iVar9 < 0) ||
           ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar9)) {
          AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,
                   "Invalid public dependency index.");
        }
        else {
          lVar26 = (long)iVar8;
          iVar8 = iVar8 + 1;
          *(int *)(file->file_ + lVar26 * 4) = iVar9;
          if (this->pool_->lazily_build_dependencies_ == false) {
            poVar2 = (once_flag *)
                     (file->options_to_interpret_).
                     super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (poVar2 != (once_flag *)0x0) {
              local_170._M_allocated_capacity = (size_type)file;
              std::
              call_once<void(&)(google::protobuf::FileDescriptor_const*),google::protobuf::FileDescriptor_const*>
                        (poVar2,FileDescriptor::DependenciesOnceInit,
                         (FileDescriptor **)&local_170._M_allocated_capacity);
            }
            local_260._0_8_ =
                 *(undefined8 *)((file->filename_).field_2._M_allocated_capacity + (long)iVar9 * 8);
            pVar35 = std::
                     _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     ::equal_range(&this_00->_M_t,(key_type *)local_260);
            std::
            _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar35.first._M_node,
                           (_Base_ptr)pVar35.second._M_node);
          }
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 < (proto->public_dependency_).current_size_);
    }
    *(int *)((long)&(file->options_to_interpret_).
                    super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                    ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar8;
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear(&(this->dependencies_)._M_t);
    if ((this->pool_->lazily_build_dependencies_ == false) &&
       (0 < *(int *)&(file->options_to_interpret_).
                     super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                     ._M_impl.super__Vector_impl_data._M_finish)) {
      lVar28 = 0;
      do {
        poVar2 = (once_flag *)
                 (file->options_to_interpret_).
                 super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (poVar2 != (once_flag *)0x0) {
          local_170._M_allocated_capacity = (size_type)file;
          std::
          call_once<void(&)(google::protobuf::FileDescriptor_const*),google::protobuf::FileDescriptor_const*>
                    (poVar2,FileDescriptor::DependenciesOnceInit,
                     (FileDescriptor **)&local_170._M_allocated_capacity);
        }
        RecordPublicDependencies
                  (this,*(FileDescriptor **)
                         ((file->filename_).field_2._M_allocated_capacity + lVar28 * 8));
        lVar28 = lVar28 + 1;
      } while (lVar28 < *(int *)&(file->options_to_interpret_).
                                 super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    pFVar10 = (FileDescriptorTables *)
              DescriptorPool::Tables::AllocateBytes
                        (this->tables_,(proto->weak_dependency_).current_size_ << 2);
    file->file_tables_ = pFVar10;
    if ((proto->weak_dependency_).current_size_ < 1) {
      iVar8 = 0;
    }
    else {
      lVar28 = 0;
      iVar8 = 0;
      do {
        iVar9 = *(int *)((long)(proto->weak_dependency_).arena_or_elements_ + lVar28 * 4);
        if ((iVar9 < 0) || ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar9))
        {
          AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,
                   "Invalid weak dependency index.");
        }
        else {
          lVar26 = (long)iVar8;
          iVar8 = iVar8 + 1;
          *(int *)((long)&(file->file_tables_->symbols_by_parent_)._M_h._M_buckets + lVar26 * 4) =
               iVar9;
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 < (proto->weak_dependency_).current_size_);
    }
    *(int *)&(file->options_to_interpret_).
             super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage = iVar8;
    iVar8 = (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)((long)&(file->options_to_interpret_).
                    super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = iVar8;
    pvVar13 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar8 * 0x90);
    *(void **)&(file->dependencies_)._M_t._M_impl = pvVar13;
    if (0 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_) {
      lVar28 = 0;
      lVar26 = 0;
      do {
        BuildMessage(this,(DescriptorProto *)
                          ((proto->message_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar26]
                     ,(Descriptor *)0x0,
                     (Descriptor *)(*(long *)&(file->dependencies_)._M_t._M_impl + lVar28));
        lVar26 = lVar26 + 1;
        lVar28 = lVar28 + 0x90;
      } while (lVar26 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_);
    }
    iVar8 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)&file->had_errors_ = iVar8;
    pvVar13 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar8 * 0x50);
    *(void **)&(file->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header = pvVar13;
    if (0 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
      lVar28 = 0;
      lVar26 = 0;
      do {
        BuildEnum(this,(EnumDescriptorProto *)
                       ((proto->enum_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar26],
                  (Descriptor *)0x0,
                  (EnumDescriptor *)
                  (*(long *)&(file->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header +
                  lVar28));
        lVar26 = lVar26 + 1;
        lVar28 = lVar28 + 0x50;
      } while (lVar26 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_);
    }
    iVar8 = (proto->service_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)&file->field_0x34 = iVar8;
    p_Var19 = (_Base_ptr)DescriptorPool::Tables::AllocateBytes(this->tables_,iVar8 * 0x30);
    (file->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var19;
    if (0 < (proto->service_).super_RepeatedPtrFieldBase.current_size_) {
      lVar28 = 0;
      lVar26 = 0;
      pvVar13 = extraout_RDX;
      do {
        BuildService(this,(ServiceDescriptorProto *)
                          ((proto->service_).super_RepeatedPtrFieldBase.rep_)->elements[lVar26],
                     pvVar13,(ServiceDescriptor *)
                             ((long)&((file->dependencies_)._M_t._M_impl.super__Rb_tree_header.
                                      _M_header._M_parent)->_M_color + lVar28));
        lVar26 = lVar26 + 1;
        lVar28 = lVar28 + 0x30;
        pvVar13 = extraout_RDX_00;
      } while (lVar26 < (proto->service_).super_RepeatedPtrFieldBase.current_size_);
    }
    iVar8 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)&(file->filename_)._M_dataplus._M_p = iVar8;
    p_Var19 = (_Base_ptr)DescriptorPool::Tables::AllocateBytes(this->tables_,iVar8 * 0x98);
    (file->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var19;
    if (0 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_) {
      lVar28 = 0;
      lVar26 = 0;
      do {
        BuildFieldOrExtension
                  (this,(FieldDescriptorProto *)
                        ((proto->extension_).super_RepeatedPtrFieldBase.rep_)->elements[lVar26],
                   (Descriptor *)0x0,
                   (FieldDescriptor *)
                   ((long)&((file->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_left)->_M_color + lVar28),true);
        lVar26 = lVar26 + 1;
        lVar28 = lVar28 + 0x98;
      } while (lVar26 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_);
    }
    if (((proto->_has_bits_).has_bits_[0] & 8) == 0) {
      (file->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    }
    else {
      puVar30 = (undefined1 *)proto->options_;
      if ((FileOptions *)puVar30 == (FileOptions *)0x0) {
        puVar30 = _FileOptions_default_instance_;
      }
      AllocateOptions(this,(FileOptions *)puVar30,(FileDescriptor *)file);
    }
    CrossLinkFile(this,(FileDescriptor *)file,proto);
    bVar7 = this->had_errors_;
    pFVar18 = extraout_RDX_01;
    if ((bool)bVar7 == false) {
      OptionInterpreter::OptionInterpreter((OptionInterpreter *)&local_170,this);
      pOVar20 = (this->options_to_interpret_).
                super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pOVar20 !=
          (this->options_to_interpret_).
          super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pFVar18 = (FileDescriptor *)(local_260 + 0x10);
          message = pOVar20->original_options;
          pMVar29 = &pOVar20->options->super_MessageLite;
          local_208 = pOVar20;
          local_170._8_8_ = pOVar20;
          iVar8 = (*((MessageLite *)&pMVar29->_vptr_MessageLite)->_vptr_MessageLite[0x15])(pMVar29);
          local_228._M_dataplus._M_p = (char *)0x14;
          local_260._0_8_ = pFVar18;
          local_260._0_8_ = std::__cxx11::string::_M_create((ulong *)local_260,(ulong)&local_228);
          local_250[0]._M_allocated_capacity = local_228._M_dataplus._M_p;
          *(undefined8 *)local_260._0_8_ = 0x707265746e696e75;
          *(undefined8 *)(local_260._0_8_ + 8) = 0x706f5f6465746572;
          *(undefined4 *)(local_260._0_8_ + 0x10) = 0x6e6f6974;
          local_260._8_8_ = local_228._M_dataplus._M_p;
          *(FileDescriptor *)(local_260._0_8_ + (long)local_228._M_dataplus._M_p) =
               (FileDescriptor)0x0;
          pFVar21 = Descriptor::FindFieldByName
                              ((Descriptor *)CONCAT44(extraout_var,iVar8),(string *)local_260);
          if ((FileDescriptor *)local_260._0_8_ != pFVar18) {
            operator_delete((void *)local_260._0_8_);
          }
          if (pFVar21 == (FieldDescriptor *)0x0) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_260,LOGLEVEL_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x187d);
            pLVar22 = internal::LogMessage::operator<<
                                ((LogMessage *)local_260,
                                 "CHECK failed: uninterpreted_options_field != nullptr: ");
            pLVar22 = internal::LogMessage::operator<<
                                (pLVar22,
                                 "No field named \"uninterpreted_option\" in the Options proto.");
            internal::LogFinisher::operator=((LogFinisher *)&local_228,pLVar22);
            internal::LogMessage::~LogMessage((LogMessage *)local_260);
          }
          (*((MessageLite *)&pMVar29->_vptr_MessageLite)->_vptr_MessageLite[0x15])(pMVar29);
          Reflection::ClearField(this_03,(Message *)pMVar29,pFVar21);
          __x = &local_208->element_path;
          std::vector<int,_std::allocator<int>_>::vector(&local_200,__x);
          local_260._0_4_ = *(int *)(pFVar21 + 0x44);
          local_1c0 = pMVar29;
          if (local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_200,
                       (iterator)
                       local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_260);
          }
          else {
            *local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = *(int *)(pFVar21 + 0x44);
            local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          iVar8 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
          local_228._M_dataplus._M_p = (pointer)0x14;
          local_260._0_8_ = pFVar18;
          local_260._0_8_ = std::__cxx11::string::_M_create((ulong *)local_260,(ulong)&local_228);
          local_250[0]._M_allocated_capacity = local_228._M_dataplus._M_p;
          *(undefined8 *)local_260._0_8_ = 0x707265746e696e75;
          *(undefined8 *)(local_260._0_8_ + 8) = 0x706f5f6465746572;
          *(undefined4 *)(local_260._0_8_ + 0x10) = 0x6e6f6974;
          local_260._8_8_ = local_228._M_dataplus._M_p;
          *(FileDescriptor *)(local_260._0_8_ + (long)local_228._M_dataplus._M_p) =
               (FileDescriptor)0x0;
          pFVar21 = Descriptor::FindFieldByName
                              ((Descriptor *)CONCAT44(extraout_var_00,iVar8),(string *)local_260);
          if ((FileDescriptor *)local_260._0_8_ != pFVar18) {
            operator_delete((void *)local_260._0_8_);
          }
          pMVar29 = local_1c0;
          if (pFVar21 == (FieldDescriptor *)0x0) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_260,LOGLEVEL_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1888);
            pMVar29 = local_1c0;
            pLVar22 = internal::LogMessage::operator<<
                                ((LogMessage *)local_260,
                                 "CHECK failed: original_uninterpreted_options_field != nullptr: ");
            pLVar22 = internal::LogMessage::operator<<
                                (pLVar22,
                                 "No field named \"uninterpreted_option\" in the Options proto.");
            internal::LogFinisher::operator=((LogFinisher *)&local_228,pLVar22);
            internal::LogMessage::~LogMessage((LogMessage *)local_260);
          }
          (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
          iVar8 = Reflection::FieldSize(this_04,message,pFVar21);
          local_260._0_8_ = local_260._0_8_ & 0xffffffff00000000;
          if (0 < iVar8) {
            iVar9 = 0;
            do {
              if (local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_200,
                           (iterator)
                           local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)local_260);
              }
              else {
                *local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar9;
                local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
              auStack_160._0_8_ =
                   Reflection::GetRepeatedMessage(this_05,message,pFVar21,local_260._0_4_);
              bVar6 = OptionInterpreter::InterpretSingleOption
                                ((OptionInterpreter *)&local_170,(Message *)pMVar29,&local_200,__x);
              if (!bVar6) {
                local_170._8_8_ = 0;
                auStack_160._0_8_ = (DescriptorPool *)0x0;
                goto LAB_002c54e7;
              }
              local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1;
              iVar9 = local_260._0_4_ + LOGLEVEL_WARNING;
              local_260._0_4_ = iVar9;
            } while (iVar9 < iVar8);
          }
          local_170._8_8_ = 0;
          auStack_160._0_8_ = (DescriptorPool *)0x0;
          iVar8 = (*pMVar29->_vptr_MessageLite[3])(pMVar29);
          this_02 = (MessageLite *)CONCAT44(extraout_var_01,iVar8);
          (*pMVar29->_vptr_MessageLite[0x15])(pMVar29);
          Reflection::Swap(this_06,(Message *)this_02,(Message *)pMVar29);
          local_260._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_250[0]._M_allocated_capacity =
               local_250[0]._M_allocated_capacity & 0xffffffffffffff00;
          local_260._0_8_ = (DescriptorBuilder *)(local_260 + 0x10);
          bVar6 = MessageLite::AppendToString(this_02,(string *)local_260);
          if ((!bVar6) ||
             (bVar6 = MessageLite::ParseFromString(pMVar29,(string *)local_260), !bVar6)) {
            local_178 = (DescriptorBuilder *)local_170._M_allocated_capacity;
            Message::ShortDebugString_abi_cxx11_(&local_b0,(Message *)this_02);
            plVar23 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x56587f)
            ;
            local_198 = (_Base_ptr)&local_188;
            p_Var19 = (_Base_ptr)(plVar23 + 2);
            if ((_Base_ptr)*plVar23 == p_Var19) {
              local_188 = *(FileDescriptor **)p_Var19;
              p_Stack_180 = (_Base_ptr)plVar23[3];
            }
            else {
              local_188 = *(FileDescriptor **)p_Var19;
              local_198 = (_Base_ptr)*plVar23;
            }
            local_190 = plVar23[1];
            *plVar23 = (long)p_Var19;
            plVar23[1] = 0;
            *(undefined1 *)(plVar23 + 2) = 0;
            plVar23 = (long *)std::__cxx11::string::append((char *)&local_198);
            local_1e8._M_allocated_capacity = (size_type)&local_1d8;
            pp_Var27 = (_Base_ptr *)(plVar23 + 2);
            if ((_Base_ptr *)*plVar23 == pp_Var27) {
              local_1d8 = *pp_Var27;
              lStack_1d0 = plVar23[3];
            }
            else {
              local_1d8 = *pp_Var27;
              local_1e8._M_allocated_capacity = (size_type)(_Base_ptr *)*plVar23;
            }
            local_1e8._8_8_ = plVar23[1];
            *plVar23 = (long)pp_Var27;
            plVar23[1] = 0;
            *(undefined1 *)(plVar23 + 2) = 0;
            Message::ShortDebugString_abi_cxx11_(&local_1b8,(Message *)pMVar29);
            p_Var19 = (_Base_ptr)0xf;
            if ((_Base_ptr *)local_1e8._M_allocated_capacity != &local_1d8) {
              p_Var19 = local_1d8;
            }
            if (p_Var19 < (_Base_ptr)(local_1b8._M_string_length + local_1e8._8_8_)) {
              uVar31 = (_Base_ptr)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                uVar31 = local_1b8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar31 < (_Base_ptr)(local_1b8._M_string_length + local_1e8._8_8_))
              goto LAB_002c53a7;
              puVar24 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_1b8,0,(char *)0x0,local_1e8._M_allocated_capacity);
            }
            else {
LAB_002c53a7:
              puVar24 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  (local_1e8._M_local_buf,(ulong)local_1b8._M_dataplus._M_p);
            }
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
            psVar1 = puVar24 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar24 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_228.field_2._M_allocated_capacity = *psVar1;
              local_228.field_2._8_8_ = puVar24[3];
            }
            else {
              local_228.field_2._M_allocated_capacity = *psVar1;
              local_228._M_dataplus._M_p = (pointer)*puVar24;
            }
            local_228._M_string_length = puVar24[1];
            *puVar24 = psVar1;
            puVar24[1] = 0;
            *(undefined1 *)psVar1 = 0;
            AddError(local_178,&local_208->element_name,message,OTHER,&local_228);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p);
            }
            if ((_Base_ptr *)local_1e8._M_allocated_capacity != &local_1d8) {
              operator_delete((void *)local_1e8._M_allocated_capacity);
            }
            if (local_198 != (_Base_ptr)&local_188) {
              operator_delete(local_198);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            (*pMVar29->_vptr_MessageLite[0x15])(pMVar29);
            Reflection::Swap(this_07,(Message *)this_02,(Message *)pMVar29);
          }
          if ((DescriptorBuilder *)local_260._0_8_ != (DescriptorBuilder *)(local_260 + 0x10)) {
            operator_delete((void *)local_260._0_8_);
          }
          (*this_02->_vptr_MessageLite[1])(this_02);
LAB_002c54e7:
          if (local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          pOVar20 = local_208 + 1;
        } while (pOVar20 !=
                 (this->options_to_interpret_).
                 super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        pOVar3 = (this->options_to_interpret_).
                 super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pOVar20 != pOVar3) {
          pOVar20 = pOVar3 + -1;
          do {
            piVar4 = pOVar20[1].element_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (piVar4 != (pointer)0x0) {
              operator_delete(piVar4);
            }
            pcVar5 = pOVar20[1].element_name._M_dataplus._M_p;
            if (&pOVar20[1].element_name.field_2 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar5) {
              operator_delete(pcVar5);
            }
            pcVar5 = pOVar20[1].name_scope._M_dataplus._M_p;
            if (&pOVar20[1].name_scope.field_2 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar5) {
              operator_delete(pcVar5);
            }
            pOVar20 = pOVar20 + 1;
          } while (pOVar20 != local_208);
          (this->options_to_interpret_).
          super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
          ._M_impl.super__Vector_impl_data._M_finish = pOVar3;
        }
      }
      if (local_1c8 != (SourceCodeInfo *)0x0) {
        OptionInterpreter::UpdateSourceCodeInfo((OptionInterpreter *)&local_170,local_1c8);
      }
      DynamicMessageFactory::~DynamicMessageFactory(&local_f8);
      std::
      _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
      ::~_Rb_tree(&local_128);
      std::
      _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)(auStack_160 + 8));
      bVar7 = this->had_errors_;
      pFVar18 = extraout_RDX_02;
    }
    if (((bVar7 & 1) == 0) && (this->pool_->lazily_build_dependencies_ == false)) {
      ValidateFileOptions(this,(FileDescriptor *)file,proto);
      bVar7 = this->had_errors_;
      pFVar18 = extraout_RDX_03;
    }
    if (((bVar7 & 1) != 0) && (0 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_))
    {
      lVar28 = 0;
      lVar26 = 0;
      do {
        DetectMapConflicts(this,(Descriptor *)
                                (*(long *)&(file->dependencies_)._M_t._M_impl + lVar28),
                           (DescriptorProto *)
                           ((proto->message_type_).super_RepeatedPtrFieldBase.rep_)->elements
                           [lVar26]);
        lVar26 = lVar26 + 1;
        lVar28 = lVar28 + 0x90;
        pFVar18 = extraout_RDX_04;
      } while (lVar26 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_);
    }
    if (((this->unused_dependency_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
       (this->pool_->lazily_build_dependencies_ == false)) {
      LogUnusedDependency(this,proto,pFVar18);
    }
    if (this->had_errors_ != false) {
      file = (DescriptorBuilder *)0x0;
    }
LAB_002c5641:
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_90);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  else {
    AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,
             "A file with this name is already in the pool.");
    file = (DescriptorBuilder *)0x0;
  }
  return (FileDescriptor *)file;
}

Assistant:

FileDescriptor* DescriptorBuilder::BuildFileImpl(
    const FileDescriptorProto& proto) {
  FileDescriptor* result = tables_->Allocate<FileDescriptor>();
  file_ = result;

  result->is_placeholder_ = false;
  result->finished_building_ = false;
  SourceCodeInfo* info = nullptr;
  if (proto.has_source_code_info()) {
    info = tables_->AllocateMessage<SourceCodeInfo>();
    info->CopyFrom(proto.source_code_info());
    result->source_code_info_ = info;
  } else {
    result->source_code_info_ = &SourceCodeInfo::default_instance();
  }

  file_tables_ = tables_->AllocateFileTables();
  file_->tables_ = file_tables_;

  if (!proto.has_name()) {
    AddError("", proto, DescriptorPool::ErrorCollector::OTHER,
             "Missing field: FileDescriptorProto.name.");
  }

  // TODO(liujisi): Report error when the syntax is empty after all the protos
  // have added the syntax statement.
  if (proto.syntax().empty() || proto.syntax() == "proto2") {
    file_->syntax_ = FileDescriptor::SYNTAX_PROTO2;
  } else if (proto.syntax() == "proto3") {
    file_->syntax_ = FileDescriptor::SYNTAX_PROTO3;
  } else {
    file_->syntax_ = FileDescriptor::SYNTAX_UNKNOWN;
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "Unrecognized syntax: " + proto.syntax());
  }

  result->name_ = tables_->AllocateString(proto.name());
  if (proto.has_package()) {
    result->package_ = tables_->AllocateString(proto.package());
  } else {
    // We cannot rely on proto.package() returning a valid string if
    // proto.has_package() is false, because we might be running at static
    // initialization time, in which case default values have not yet been
    // initialized.
    result->package_ = tables_->AllocateString("");
  }
  result->pool_ = pool_;

  // Add to tables.
  if (!tables_->AddFile(result)) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "A file with this name is already in the pool.");
    // Bail out early so that if this is actually the exact same file, we
    // don't end up reporting that every single symbol is already defined.
    return nullptr;
  }
  if (!result->package().empty()) {
    AddPackage(result->package(), proto, result);
  }

  // Make sure all dependencies are loaded.
  std::set<std::string> seen_dependencies;
  result->dependency_count_ = proto.dependency_size();
  result->dependencies_ =
      tables_->AllocateArray<const FileDescriptor*>(proto.dependency_size());
  if (pool_->lazily_build_dependencies_) {
    result->dependencies_once_ = tables_->AllocateOnceDynamic();
    result->dependencies_names_ =
        tables_->AllocateArray<const std::string*>(proto.dependency_size());
    if (proto.dependency_size() > 0) {
      memset(result->dependencies_names_, 0,
             sizeof(*result->dependencies_names_) * proto.dependency_size());
    }
  } else {
    result->dependencies_once_ = nullptr;
    result->dependencies_names_ = nullptr;
  }
  unused_dependency_.clear();
  std::set<int> weak_deps;
  for (int i = 0; i < proto.weak_dependency_size(); ++i) {
    weak_deps.insert(proto.weak_dependency(i));
  }
  for (int i = 0; i < proto.dependency_size(); i++) {
    if (!seen_dependencies.insert(proto.dependency(i)).second) {
      AddTwiceListedError(proto, i);
    }

    const FileDescriptor* dependency = tables_->FindFile(proto.dependency(i));
    if (dependency == nullptr && pool_->underlay_ != nullptr) {
      dependency = pool_->underlay_->FindFileByName(proto.dependency(i));
    }

    if (dependency == result) {
      // Recursive import.  dependency/result is not fully initialized, and it's
      // dangerous to try to do anything with it.  The recursive import error
      // will be detected and reported in DescriptorBuilder::BuildFile().
      return nullptr;
    }

    if (dependency == nullptr) {
      if (!pool_->lazily_build_dependencies_) {
        if (pool_->allow_unknown_ ||
            (!pool_->enforce_weak_ && weak_deps.find(i) != weak_deps.end())) {
          dependency =
              pool_->NewPlaceholderFileWithMutexHeld(proto.dependency(i));
        } else {
          AddImportError(proto, i);
        }
      }
    } else {
      // Add to unused_dependency_ to track unused imported files.
      // Note: do not track unused imported files for public import.
      if (pool_->enforce_dependencies_ &&
          (pool_->unused_import_track_files_.find(proto.name()) !=
           pool_->unused_import_track_files_.end()) &&
          (dependency->public_dependency_count() == 0)) {
        unused_dependency_.insert(dependency);
      }
    }

    result->dependencies_[i] = dependency;
    if (pool_->lazily_build_dependencies_ && !dependency) {
      result->dependencies_names_[i] =
          tables_->AllocateString(proto.dependency(i));
    }
  }

  // Check public dependencies.
  int public_dependency_count = 0;
  result->public_dependencies_ =
      tables_->AllocateArray<int>(proto.public_dependency_size());
  for (int i = 0; i < proto.public_dependency_size(); i++) {
    // Only put valid public dependency indexes.
    int index = proto.public_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->public_dependencies_[public_dependency_count++] = index;
      // Do not track unused imported files for public import.
      // Calling dependency(i) builds that file when doing lazy imports,
      // need to avoid doing this. Unused dependency detection isn't done
      // when building lazily, anyways.
      if (!pool_->lazily_build_dependencies_) {
        unused_dependency_.erase(result->dependency(index));
      }
    } else {
      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               "Invalid public dependency index.");
    }
  }
  result->public_dependency_count_ = public_dependency_count;

  // Build dependency set
  dependencies_.clear();
  // We don't/can't do proper dependency error checking when
  // lazily_build_dependencies_, and calling dependency(i) will force
  // a dependency to be built, which we don't want.
  if (!pool_->lazily_build_dependencies_) {
    for (int i = 0; i < result->dependency_count(); i++) {
      RecordPublicDependencies(result->dependency(i));
    }
  }

  // Check weak dependencies.
  int weak_dependency_count = 0;
  result->weak_dependencies_ =
      tables_->AllocateArray<int>(proto.weak_dependency_size());
  for (int i = 0; i < proto.weak_dependency_size(); i++) {
    int index = proto.weak_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->weak_dependencies_[weak_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               "Invalid weak dependency index.");
    }
  }
  result->weak_dependency_count_ = weak_dependency_count;

  // Convert children.
  BUILD_ARRAY(proto, result, message_type, BuildMessage, nullptr);
  BUILD_ARRAY(proto, result, enum_type, BuildEnum, nullptr);
  BUILD_ARRAY(proto, result, service, BuildService, nullptr);
  BUILD_ARRAY(proto, result, extension, BuildExtension, nullptr);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = nullptr;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  // Note that the following steps must occur in exactly the specified order.

  // Cross-link.
  CrossLinkFile(result, proto);

  // Interpret any remaining uninterpreted options gathered into
  // options_to_interpret_ during descriptor building.  Cross-linking has made
  // extension options known, so all interpretations should now succeed.
  if (!had_errors_) {
    OptionInterpreter option_interpreter(this);
    for (std::vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretOptions(&(*iter));
    }
    options_to_interpret_.clear();
    if (info != nullptr) {
      option_interpreter.UpdateSourceCodeInfo(info);
    }
  }

  // Validate options. See comments at InternalSetLazilyBuildDependencies about
  // error checking and lazy import building.
  if (!had_errors_ && !pool_->lazily_build_dependencies_) {
    ValidateFileOptions(result, proto);
  }

  // Additional naming conflict check for map entry types. Only need to check
  // this if there are already errors.
  if (had_errors_) {
    for (int i = 0; i < proto.message_type_size(); ++i) {
      DetectMapConflicts(result->message_type(i), proto.message_type(i));
    }
  }


  // Again, see comments at InternalSetLazilyBuildDependencies about error
  // checking.
  if (!unused_dependency_.empty() && !pool_->lazily_build_dependencies_) {
    LogUnusedDependency(proto, result);
  }

  if (had_errors_) {
    return nullptr;
  } else {
    return result;
  }
}